

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

LabelOpnd * IR::LabelOpnd::New(LabelInstr *labelInstr,Func *func)

{
  LabelOpnd *this;
  
  this = (LabelOpnd *)new<Memory::JitArenaAllocator>(0x18,func->m_alloc,0x3d6ef4);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (this->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (this->super_Opnd).m_type = TyIllegal;
  (this->super_Opnd).field_0xb = 0;
  (this->super_Opnd).m_kind = OpndKindInvalid;
  (this->super_Opnd).isDeleted = false;
  *(undefined2 *)&(this->super_Opnd).field_0xe = 0;
  this->m_label = (LabelInstr *)0x0;
  LabelOpnd(this);
  this->m_label = labelInstr;
  (this->super_Opnd).m_type = TyUint64;
  labelInstr->field_0x78 = labelInstr->field_0x78 | 4;
  (this->super_Opnd).m_kind = OpndKindLabel;
  return this;
}

Assistant:

LabelOpnd *
LabelOpnd::New(LabelInstr * labelInstr, Func * func)
{
    LabelOpnd * labelOpnd = JitAnew(func->m_alloc, IR::LabelOpnd);

    labelOpnd->m_label = labelInstr;
    labelOpnd->m_type = TyMachPtr;

    labelInstr->m_hasNonBranchRef = true;


    labelOpnd->m_kind = OpndKindLabel;

    return labelOpnd;
}